

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O1

int coda_cursor_goto_next_array_element(coda_cursor_conflict *cursor)

{
  coda_backend cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  coda_type *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  
  if (cursor == (coda_cursor_conflict *)0x0) {
LAB_0010fda1:
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x469);
    return -1;
  }
  lVar5 = (long)cursor->n;
  if ((lVar5 < 2) ||
     (cursor->stack[lVar5 - 1U & 0xffffffff].type == (coda_dynamic_type_struct *)0x0))
  goto LAB_0010fda1;
  uVar2 = cursor->n - 2;
  pcVar6 = (coda_type *)cursor->stack[uVar2].type;
  if (99 < pcVar6->format) {
    pcVar6 = *(coda_type **)&pcVar6->type_class;
  }
  if (pcVar6->type_class != coda_array_class) {
    pcVar7 = coda_type_get_class_name(pcVar6->type_class);
    coda_set_error(-0x69,"parent of cursor does not refer to an array (current type is %s)",pcVar7);
    return -1;
  }
  if (cursor->stack[lVar5 + -1].index == -1) {
    pcVar7 = 
    "cursor does not refer to an array element (currently pointing to the array attributes)";
    iVar3 = -0x69;
    goto LAB_0010fe29;
  }
  cVar1 = (cursor->stack[(int)uVar2].type)->backend;
  switch(cVar1) {
  case coda_backend_memory:
    iVar3 = coda_mem_cursor_goto_next_array_element(cursor);
    break;
  case coda_backend_hdf4:
    iVar3 = -0xb;
    goto LAB_0010fe27;
  case coda_backend_hdf5:
    iVar3 = -0xd;
LAB_0010fe27:
    pcVar7 = (char *)0x0;
LAB_0010fe29:
    coda_set_error(iVar3,pcVar7);
    return -1;
  case coda_backend_cdf:
    iVar3 = coda_cdf_cursor_goto_next_array_element(cursor);
    break;
  case coda_backend_netcdf:
    iVar3 = coda_netcdf_cursor_goto_next_array_element(cursor);
    break;
  case coda_backend_grib:
    iVar3 = coda_grib_cursor_goto_next_array_element(cursor);
    break;
  default:
    if (cVar1 < 2) {
      iVar3 = coda_ascbin_cursor_goto_next_array_element(cursor);
      break;
    }
    goto LAB_0010fe45;
  }
  iVar4 = -1;
  if (iVar3 == 0) {
LAB_0010fe45:
    if ((cursor->stack[(long)cursor->n + -1].type)->backend == coda_backend_memory) {
      coda_mem_cursor_update_offset(cursor);
    }
    if (*(int *)(in_FS_OFFSET + -0x38) != 0) {
      pcVar6 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
      if (99 < pcVar6->format) {
        pcVar6 = *(coda_type **)&pcVar6->type_class;
      }
      if ((pcVar6->type_class == 6) &&
         (iVar3 = coda_cursor_use_base_type_of_special_type(cursor), iVar3 != 0)) {
        return -1;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

LIBCODA_API int coda_cursor_goto_next_array_element(coda_cursor *cursor)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 1 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 2].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "parent of cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check whether we are perhaps pointing to the attributes of the array */
    if (cursor->stack[cursor->n - 1].index == -1)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE,
                       "cursor does not refer to an array element (currently pointing to the array attributes)");
        return -1;
    }

    switch (cursor->stack[cursor->n - 2].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            if (coda_ascbin_cursor_goto_next_array_element(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_memory:
            if (coda_mem_cursor_goto_next_array_element(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            if (coda_hdf4_cursor_goto_next_array_element(cursor) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            if (coda_hdf5_cursor_goto_next_array_element(cursor) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            if (coda_cdf_cursor_goto_next_array_element(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_netcdf:
            if (coda_netcdf_cursor_goto_next_array_element(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_grib:
            if (coda_grib_cursor_goto_next_array_element(cursor) != 0)
            {
                return -1;
            }
            break;
    }

    if (cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        coda_mem_cursor_update_offset(cursor);
    }

    if (coda_option_bypass_special_types &&
        coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->type_class == coda_special_class)
    {
        if (coda_cursor_use_base_type_of_special_type(cursor) != 0)
        {
            return -1;
        }
    }

    return 0;
}